

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O1

sensor * __thiscall ev3dev::sensor::set_mode(sensor *this,string *v)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"mode","");
  device::set_attr_string(&this->super_device,&local_40,v);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return this;
}

Assistant:

sensor& set_mode(std::string v) {
            set_attr_string("mode", v);
            return *this;
        }